

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,CallInst *CI,PSNode *arg,uint idx)

{
  bool bVar1;
  PSNode *n;
  
  n = tryGetOperand(this,*(Value **)
                          (CI + ((ulong)idx * 0x20 - (ulong)(uint)(*(int *)(CI + 0x14) << 5))));
  if (n != (PSNode *)0x0) {
    bVar1 = SubgraphNode<dg::pta::PSNode>::hasOperand(&arg->super_SubgraphNode<dg::pta::PSNode>,n);
    if (!bVar1) {
      SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
                (&arg->super_SubgraphNode<dg::pta::PSNode>,n);
      return;
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::CallInst *CI,
                                                  PSNode *arg, unsigned idx) {
    assert(idx < llvmutils::getNumArgOperands(CI));
    PSNode *op = tryGetOperand(CI->getArgOperand(idx));
    if (op && !arg->hasOperand(op)) {
        // NOTE: do not add an operand multiple-times
        // (when a function is called multiple-times with
        // the same actual parameters)
        arg->addOperand(op);
    }
}